

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

void MRIStepCoupling_Write(MRIStepCoupling MRIC,FILE *outfile)

{
  sunrealtype **ppsVar1;
  uint uVar2;
  sunrealtype **ppsVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    if (MRIC->W == (sunrealtype ***)0x0) {
      if (MRIC->G == (sunrealtype ***)0x0) {
        return;
      }
      if (MRIC->c == (sunrealtype *)0x0) {
        return;
      }
      uVar2 = MRIC->nmat;
    }
    else {
      if (MRIC->c == (sunrealtype *)0x0) {
        return;
      }
      uVar2 = MRIC->nmat;
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        ppsVar3 = MRIC->W[uVar6];
        if (ppsVar3 == (sunrealtype **)0x0) {
          return;
        }
        uVar4 = MRIC->stages;
        if (MRIC->stages < 1) {
          uVar4 = 0;
        }
        uVar7 = 0;
        while (uVar4 != uVar7) {
          ppsVar1 = ppsVar3 + uVar7;
          uVar7 = uVar7 + 1;
          if (*ppsVar1 == (sunrealtype *)0x0) {
            return;
          }
        }
      }
    }
    if (MRIC->G != (sunrealtype ***)0x0) {
      uVar5 = 0;
      if (0 < (int)uVar2) {
        uVar5 = (ulong)uVar2;
      }
      for (uVar6 = 0; uVar6 != uVar5; uVar6 = uVar6 + 1) {
        ppsVar3 = MRIC->G[uVar6];
        if (ppsVar3 == (sunrealtype **)0x0) {
          return;
        }
        uVar2 = MRIC->stages;
        if (MRIC->stages < 1) {
          uVar2 = 0;
        }
        uVar7 = 0;
        while (uVar2 != uVar7) {
          ppsVar1 = ppsVar3 + uVar7;
          uVar7 = uVar7 + 1;
          if (*ppsVar1 == (sunrealtype *)0x0) {
            return;
          }
        }
      }
    }
    fprintf((FILE *)outfile,"  nmat = %i\n");
    fprintf((FILE *)outfile,"  stages = %i\n",(ulong)(uint)MRIC->stages);
    fprintf((FILE *)outfile,"  method order (q) = %i\n",(ulong)(uint)MRIC->q);
    fprintf((FILE *)outfile,"  embedding order (p) = %i\n",(ulong)(uint)MRIC->p);
    fwrite("  c = ",6,1,(FILE *)outfile);
    for (lVar9 = 0; lVar9 < MRIC->stages; lVar9 = lVar9 + 1) {
      fprintf((FILE *)outfile,"%.16g  ",MRIC->c[lVar9]);
    }
    fputc(10,(FILE *)outfile);
    if (MRIC->W != (sunrealtype ***)0x0) {
      for (uVar5 = 0; (long)uVar5 < (long)MRIC->nmat; uVar5 = uVar5 + 1) {
        fprintf((FILE *)outfile,"  W[%i] = \n",uVar5 & 0xffffffff);
        for (lVar9 = 0; lVar9 < MRIC->stages; lVar9 = lVar9 + 1) {
          fwrite("      ",6,1,(FILE *)outfile);
          for (lVar8 = 0; lVar8 < MRIC->stages; lVar8 = lVar8 + 1) {
            fprintf((FILE *)outfile,"%23.16g  ",MRIC->W[uVar5][lVar9][lVar8]);
          }
          fputc(10,(FILE *)outfile);
        }
        fputc(10,(FILE *)outfile);
      }
    }
    if (MRIC->G != (sunrealtype ***)0x0) {
      for (uVar5 = 0; (long)uVar5 < (long)MRIC->nmat; uVar5 = uVar5 + 1) {
        fprintf((FILE *)outfile,"  G[%i] = \n",uVar5 & 0xffffffff);
        for (lVar9 = 0; lVar9 < MRIC->stages; lVar9 = lVar9 + 1) {
          fwrite("      ",6,1,(FILE *)outfile);
          for (lVar8 = 0; lVar8 < MRIC->stages; lVar8 = lVar8 + 1) {
            fprintf((FILE *)outfile,"%23.16g  ",MRIC->G[uVar5][lVar9][lVar8]);
          }
          fputc(10,(FILE *)outfile);
        }
        fputc(10,(FILE *)outfile);
      }
    }
  }
  return;
}

Assistant:

void MRIStepCoupling_Write(MRIStepCoupling MRIC, FILE* outfile)
{
  int i, j, k;

  /* check for vaild coupling structure */
  if (!MRIC) { return; }
  if (!(MRIC->W) && !(MRIC->G)) { return; }
  if (!(MRIC->c)) { return; }

  if (MRIC->W)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->W[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->W[i][j])) { return; }
      }
    }
  }

  if (MRIC->G)
  {
    for (i = 0; i < MRIC->nmat; i++)
    {
      if (!(MRIC->G[i])) { return; }
      for (j = 0; j < MRIC->stages; j++)
      {
        if (!(MRIC->G[i][j])) { return; }
      }
    }
  }

  fprintf(outfile, "  nmat = %i\n", MRIC->nmat);
  fprintf(outfile, "  stages = %i\n", MRIC->stages);
  fprintf(outfile, "  method order (q) = %i\n", MRIC->q);
  fprintf(outfile, "  embedding order (p) = %i\n", MRIC->p);
  fprintf(outfile, "  c = ");
  for (i = 0; i < MRIC->stages; i++)
  {
    fprintf(outfile, "%" RSYM "  ", MRIC->c[i]);
  }
  fprintf(outfile, "\n");

  if (MRIC->W)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  W[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->W[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }

  if (MRIC->G)
  {
    for (k = 0; k < MRIC->nmat; k++)
    {
      fprintf(outfile, "  G[%i] = \n", k);
      for (i = 0; i < MRIC->stages; i++)
      {
        fprintf(outfile, "      ");
        for (j = 0; j < MRIC->stages; j++)
        {
          fprintf(outfile, "%" RSYMW "  ", MRIC->G[k][i][j]);
        }
        fprintf(outfile, "\n");
      }
      fprintf(outfile, "\n");
    }
  }
}